

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtt.c
# Opt level: O0

void parse_timestamps(utf8_char_t *line,double *start_pts,double *end_pts,char **cue_settings)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  long *in_RCX;
  double *in_RDX;
  double *in_RSI;
  undefined8 in_RDI;
  double dVar5;
  int cue_size;
  int matches;
  char cue_str [1024];
  char end_str [32];
  char start_str [32];
  utf8_char_t *in_stack_fffffffffffffb98;
  undefined1 local_68 [32];
  undefined1 local_48 [40];
  long *local_20;
  double *local_18;
  double *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar1 = __isoc99_sscanf(in_RDI," %31s --> %31s%1023[^\n\r]",local_48,local_68,
                          &stack0xfffffffffffffb98);
  *local_10 = -1.0;
  *local_20 = 0;
  printf("Matches: %d\n",(ulong)uVar1);
  if (0 < (int)uVar1) {
    dVar5 = parse_timestamp(in_stack_fffffffffffffb98);
    *local_10 = dVar5;
    printf("Start pts: %f\n",*local_10);
  }
  if (1 < (int)uVar1) {
    dVar5 = parse_timestamp(in_stack_fffffffffffffb98);
    *local_18 = dVar5;
  }
  if (uVar1 == 3) {
    sVar3 = strlen(&stack0xfffffffffffffb98);
    if (sVar3 != 0) {
      sVar3 = strlen(&stack0xfffffffffffffb98);
      iVar2 = (int)sVar3;
      pvVar4 = malloc((long)(iVar2 + 1));
      *local_20 = (long)pvVar4;
      strncpy((char *)*local_20,&stack0xfffffffffffffb98,(long)iVar2);
      *(undefined1 *)(*local_20 + (long)iVar2) = 0;
    }
  }
  return;
}

Assistant:

void parse_timestamps(const utf8_char_t* line, double* start_pts, double* end_pts, char** cue_settings)
{
    char start_str[32];
    char end_str[32];
    char cue_str[1024];

    int matches = sscanf(line, " %31s --> %31s%1023[^\n\r]", start_str, end_str, cue_str);
    *start_pts = -1;
    *cue_settings = NULL;

    printf("Matches: %d\n", matches);

    if (matches >= 1) {
        *start_pts = parse_timestamp(start_str);
        printf("Start pts: %f\n", *start_pts);
    }
    if (matches >= 2) {
        *end_pts = parse_timestamp(end_str);
    }
    if ((matches == 3) && (strlen(cue_str) > 0)) {
        int cue_size = strlen(cue_str);
        *cue_settings = malloc(cue_size + 1);
        strncpy(*cue_settings, cue_str, cue_size);
        (*cue_settings)[cue_size] = '\0';
    }
}